

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O2

int nghttp2_bufs_addb(nghttp2_bufs *bufs,uint8_t b)

{
  uint8_t *puVar1;
  int iVar2;
  
  iVar2 = bufs_ensure_addb(bufs);
  if (iVar2 == 0) {
    puVar1 = (bufs->cur->buf).last;
    (bufs->cur->buf).last = puVar1 + 1;
    *puVar1 = b;
  }
  return iVar2;
}

Assistant:

int nghttp2_bufs_addb(nghttp2_bufs *bufs, uint8_t b) {
  int rv;

  rv = bufs_ensure_addb(bufs);
  if (rv != 0) {
    return rv;
  }

#ifdef __clang_analyzer__
  assert(bufs->cur->buf.last);
#endif

  *bufs->cur->buf.last++ = b;

  return 0;
}